

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O0

_Bool borg_dimension_door(wchar_t allow_fail)

{
  loc t;
  _Bool _Var1;
  wchar_t x;
  wchar_t y;
  wchar_t wVar2;
  loc_conflict grid;
  wchar_t range;
  loc target;
  wchar_t best_d;
  wchar_t d;
  loc best;
  wchar_t t_y;
  wchar_t t_x;
  wchar_t y_off;
  wchar_t x_off;
  wchar_t allow_fail_local;
  
  _Var1 = borg_spell_okay_fail(DIMENSION_DOOR,allow_fail);
  if (_Var1) {
    target.x = (int)borg_fear_region[borg.c.y][borg.c.x];
    for (t_x = L'\xffffffce'; t_x < L'2'; t_x = t_x + L'\x01') {
      for (t_y = L'\xffffffce'; t_y < L'2'; t_y = t_y + L'\x01') {
        x = borg.c.x + t_x;
        y = borg.c.y + t_y;
        if ((L'\xffffffff' < x) && (L'\xffffffff' < y)) {
          grid = (loc_conflict)loc(borg.c.x + t_x,borg.c.y + t_y);
          _Var1 = square_in_bounds_fully((chunk *)cave,grid);
          if ((_Var1) && (wVar2 = borg_danger(y,x,L'\x02',true,false), wVar2 < target.x)) {
            target.x = wVar2;
            best_d = x;
            d = y;
          }
        }
      }
    }
    if (target.x < (int)(uint)borg_fear_region[borg.c.y][borg.c.x]) {
      t.y = d;
      t.x = best_d;
      borg_target(t);
      borg_spell(DIMENSION_DOOR);
      borg_keypress(0x35);
      x_off._3_1_ = true;
    }
    else {
      x_off._3_1_ = false;
    }
  }
  else {
    x_off._3_1_ = false;
  }
  return x_off._3_1_;
}

Assistant:

bool borg_dimension_door(int allow_fail)
{
    int        x_off, y_off;
    int        t_x, t_y;
    struct loc best;
    int        d, best_d = 0;
    struct loc target;

    /* for now keep the range at under 50, for performance */
    int range = 50;

    /* Require ability (right now) */
    if (!borg_spell_okay_fail(DIMENSION_DOOR, allow_fail))
        return 0;

    /* if we are attacking, calculate gains, but if this is just a teleport */
    /* the current danger is the starting point */
    best_d = borg_fear_region[borg.c.y][borg.c.x];

    /* Pick a location */
    for (x_off = range * -1; x_off < range; x_off++) {
        for (y_off = range * -1; y_off < range; y_off++) {
            t_x = borg.c.x + x_off;
            t_y = borg.c.y + y_off;

            if (t_x < 0 || t_y < 0)
                continue;

            target = loc(borg.c.x + x_off, borg.c.y + y_off);

            if (!square_in_bounds_fully(cave, target))
                continue;

            d = borg_danger(t_y, t_x, 2, true, false);
            if (d < best_d) {
                best_d = d;
                best.x = t_x;
                best.y = t_y;
            }
        }
    }

    if (best_d < borg_fear_region[borg.c.y][borg.c.x]) {
        borg_target(best);

        borg_spell(DIMENSION_DOOR);

        /* pick target */
        borg_keypress('5');
        return true;
    }
    return false;
}